

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::Swap
          (GeneratedMessageReflection *this,Message *message1,Message *message2)

{
  undefined1 uVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  LogMessage *pLVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Descriptor *pDVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar12;
  long *plVar13;
  undefined8 *puVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  LogFinisher local_71;
  Message *local_70;
  LogMessage local_68;
  
  if (message1 != message2) {
    iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x12])(message1);
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var,iVar6) != this) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x13b);
      pLVar8 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar8 = LogMessage::operator<<(pLVar8,"First argument to Swap() (of type \"");
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(CONCAT44(extraout_var_00,iVar6) + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(this->descriptor_ + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=(&local_71,pLVar8);
      LogMessage::~LogMessage(&local_68);
    }
    iVar6 = (*(message2->super_MessageLite)._vptr_MessageLite[0x12])();
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var_01,iVar6) != this) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x142);
      pLVar8 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar8 = LogMessage::operator<<(pLVar8,"Second argument to Swap() (of type \"");
      iVar6 = (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(CONCAT44(extraout_var_02,iVar6) + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(this->descriptor_ + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=(&local_71,pLVar8);
      LogMessage::~LogMessage(&local_68);
    }
    pDVar9 = this->descriptor_;
    uVar2 = *(uint *)(pDVar9 + 0x2c);
    if (0 < (int)uVar2) {
      lVar12 = (long)this->has_bits_offset_;
      uVar15 = 0;
      do {
        uVar3 = *(undefined4 *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar15 * 4 + lVar12);
        *(undefined4 *)
         ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar15 * 4 + lVar12) =
             *(undefined4 *)
              ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar15 * 4 + lVar12);
        *(undefined4 *)
         ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar15 * 4 + lVar12) = uVar3;
        uVar15 = uVar15 + 1;
      } while ((ulong)uVar2 + 0x1f >> 5 != uVar15);
      if (0 < *(int *)(pDVar9 + 0x2c)) {
        lVar12 = 0;
        lVar17 = 0;
        local_70 = message2;
        do {
          lVar16 = *(long *)(pDVar9 + 0x30);
          lVar10 = lVar17 * 0x78 + lVar16;
          if (*(int *)(lVar16 + 0x30 + lVar12) == 3) {
            switch(*(undefined4 *)
                    (FieldDescriptor::kTypeToCppTypeMap +
                    (ulong)*(uint *)(lVar16 + 0x2c + lVar12) * 4)) {
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            case 6:
            case 7:
            case 8:
              if (*(char *)(lVar16 + 0x34 + lVar12) == '\x01') {
                lVar4 = *(long *)(lVar16 + 0x40 + lVar12);
                if (lVar4 == 0) {
                  lVar4 = *(long *)(lVar12 + 0x20 + lVar16);
                  lVar10 = lVar16 + lVar12;
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x80);
                  plVar13 = (long *)(lVar4 + 0x80);
                }
                else {
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x70);
                  plVar13 = (long *)(lVar4 + 0x70);
                }
              }
              else {
                lVar4 = *(long *)(lVar16 + 0x38 + lVar12);
                lVar16 = lVar16 - *(long *)(lVar4 + 0x30);
                plVar13 = (long *)(lVar4 + 0x30);
              }
              puVar14 = (undefined8 *)
                        ((long)&(message1->super_MessageLite)._vptr_MessageLite +
                        (long)this->offsets_[(int)((ulong)(lVar16 + lVar12) >> 3) * -0x11111111]);
              puVar11 = (undefined8 *)
                        ((long)&(message2->super_MessageLite)._vptr_MessageLite +
                        (long)this->offsets_[(int)((ulong)(lVar10 - *plVar13) >> 3) * -0x11111111]);
              if (puVar14 != puVar11) {
                uVar5 = *puVar14;
                *puVar14 = *puVar11;
                *puVar11 = uVar5;
                uVar5 = puVar14[1];
                puVar14[1] = puVar11[1];
                puVar11[1] = uVar5;
              }
              break;
            case 9:
            case 10:
              if (*(char *)(lVar16 + 0x34 + lVar12) == '\x01') {
                lVar4 = *(long *)(lVar16 + 0x40 + lVar12);
                if (lVar4 == 0) {
                  lVar4 = *(long *)(lVar12 + 0x20 + lVar16);
                  lVar10 = lVar16 + lVar12;
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x80);
                  plVar13 = (long *)(lVar4 + 0x80);
                }
                else {
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x70);
                  plVar13 = (long *)(lVar4 + 0x70);
                }
              }
              else {
                lVar4 = *(long *)(lVar16 + 0x38 + lVar12);
                lVar16 = lVar16 - *(long *)(lVar4 + 0x30);
                plVar13 = (long *)(lVar4 + 0x30);
              }
              RepeatedPtrFieldBase::Swap
                        ((RepeatedPtrFieldBase *)
                         ((long)&(message1->super_MessageLite)._vptr_MessageLite +
                         (long)this->offsets_[(int)((ulong)(lVar16 + lVar12) >> 3) * -0x11111111]),
                         (RepeatedPtrFieldBase *)
                         ((long)&(message2->super_MessageLite)._vptr_MessageLite +
                         (long)this->offsets_[(int)((ulong)(lVar10 - *plVar13) >> 3) * -0x11111111])
                        );
              break;
            default:
              LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                         ,0x16d);
              pLVar8 = LogMessage::operator<<(&local_68,"Unimplemented type: ");
              pLVar8 = LogMessage::operator<<
                                 (pLVar8,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                                 (ulong)*(uint *)(lVar16 + 0x2c + lVar12) * 4));
              LogFinisher::operator=(&local_71,pLVar8);
LAB_00208aad:
              message2 = local_70;
              LogMessage::~LogMessage(&local_68);
            }
          }
          else {
            switch(*(undefined4 *)
                    (FieldDescriptor::kTypeToCppTypeMap +
                    (ulong)*(uint *)(lVar16 + 0x2c + lVar12) * 4)) {
            case 1:
            case 3:
            case 8:
              if (*(char *)(lVar16 + 0x34 + lVar12) == '\x01') {
                lVar4 = *(long *)(lVar16 + 0x40 + lVar12);
                if (lVar4 == 0) {
                  lVar4 = *(long *)(lVar12 + 0x20 + lVar16);
                  lVar10 = lVar16 + lVar12;
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x80);
                  plVar13 = (long *)(lVar4 + 0x80);
                }
                else {
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x70);
                  plVar13 = (long *)(lVar4 + 0x70);
                }
              }
              else {
                lVar4 = *(long *)(lVar16 + 0x38 + lVar12);
                lVar16 = lVar16 - *(long *)(lVar4 + 0x30);
                plVar13 = (long *)(lVar4 + 0x30);
              }
              lVar16 = (long)this->offsets_[(int)((ulong)(lVar16 + lVar12) >> 3) * -0x11111111];
              lVar10 = (long)this->offsets_[(int)((ulong)(lVar10 - *plVar13) >> 3) * -0x11111111];
              uVar3 = *(undefined4 *)
                       ((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16);
              *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16) =
                   *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10);
              *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10) =
                   uVar3;
              break;
            case 2:
            case 4:
            case 9:
            case 10:
              if (*(char *)(lVar16 + 0x34 + lVar12) == '\x01') {
                lVar4 = *(long *)(lVar16 + 0x40 + lVar12);
                if (lVar4 == 0) {
                  lVar4 = *(long *)(lVar12 + 0x20 + lVar16);
                  lVar10 = lVar16 + lVar12;
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x80);
                  plVar13 = (long *)(lVar4 + 0x80);
                }
                else {
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x70);
                  plVar13 = (long *)(lVar4 + 0x70);
                }
              }
              else {
                lVar4 = *(long *)(lVar16 + 0x38 + lVar12);
                lVar16 = lVar16 - *(long *)(lVar4 + 0x30);
                plVar13 = (long *)(lVar4 + 0x30);
              }
              lVar16 = (long)this->offsets_[(int)((ulong)(lVar16 + lVar12) >> 3) * -0x11111111];
              lVar10 = (long)this->offsets_[(int)((ulong)(lVar10 - *plVar13) >> 3) * -0x11111111];
              uVar5 = *(undefined8 *)
                       ((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16);
              *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16) =
                   *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10);
              *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10) =
                   uVar5;
              break;
            case 5:
              if (*(char *)(lVar16 + 0x34 + lVar12) == '\x01') {
                lVar4 = *(long *)(lVar16 + 0x40 + lVar12);
                if (lVar4 == 0) {
                  lVar4 = *(long *)(lVar12 + 0x20 + lVar16);
                  lVar10 = lVar16 + lVar12;
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x80);
                  plVar13 = (long *)(lVar4 + 0x80);
                }
                else {
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x70);
                  plVar13 = (long *)(lVar4 + 0x70);
                }
              }
              else {
                lVar4 = *(long *)(lVar16 + 0x38 + lVar12);
                lVar16 = lVar16 - *(long *)(lVar4 + 0x30);
                plVar13 = (long *)(lVar4 + 0x30);
              }
              lVar16 = (long)this->offsets_[(int)((ulong)(lVar16 + lVar12) >> 3) * -0x11111111];
              lVar10 = (long)this->offsets_[(int)((ulong)(lVar10 - *plVar13) >> 3) * -0x11111111];
              uVar5 = *(undefined8 *)
                       ((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16);
              *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16) =
                   *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10);
              *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10) =
                   uVar5;
              break;
            case 6:
              if (*(char *)(lVar16 + 0x34 + lVar12) == '\x01') {
                lVar4 = *(long *)(lVar16 + 0x40 + lVar12);
                if (lVar4 == 0) {
                  lVar4 = *(long *)(lVar12 + 0x20 + lVar16);
                  lVar10 = lVar16 + lVar12;
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x80);
                  plVar13 = (long *)(lVar4 + 0x80);
                }
                else {
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x70);
                  plVar13 = (long *)(lVar4 + 0x70);
                }
              }
              else {
                lVar4 = *(long *)(lVar16 + 0x38 + lVar12);
                lVar16 = lVar16 - *(long *)(lVar4 + 0x30);
                plVar13 = (long *)(lVar4 + 0x30);
              }
              lVar16 = (long)this->offsets_[(int)((ulong)(lVar16 + lVar12) >> 3) * -0x11111111];
              lVar10 = (long)this->offsets_[(int)((ulong)(lVar10 - *plVar13) >> 3) * -0x11111111];
              uVar3 = *(undefined4 *)
                       ((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16);
              *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16) =
                   *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10);
              *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10) =
                   uVar3;
              break;
            case 7:
              if (*(char *)(lVar16 + 0x34 + lVar12) == '\x01') {
                lVar4 = *(long *)(lVar16 + 0x40 + lVar12);
                if (lVar4 == 0) {
                  lVar4 = *(long *)(lVar12 + 0x20 + lVar16);
                  lVar10 = lVar16 + lVar12;
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x80);
                  plVar13 = (long *)(lVar4 + 0x80);
                }
                else {
                  lVar16 = lVar16 - *(long *)(lVar4 + 0x70);
                  plVar13 = (long *)(lVar4 + 0x70);
                }
              }
              else {
                lVar4 = *(long *)(lVar16 + 0x38 + lVar12);
                lVar16 = lVar16 - *(long *)(lVar4 + 0x30);
                plVar13 = (long *)(lVar4 + 0x30);
              }
              lVar16 = (long)this->offsets_[(int)((ulong)(lVar16 + lVar12) >> 3) * -0x11111111];
              lVar10 = (long)this->offsets_[(int)((ulong)(lVar10 - *plVar13) >> 3) * -0x11111111];
              uVar1 = *(undefined1 *)
                       ((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16);
              *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar16) =
                   *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10);
              *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar10) =
                   uVar1;
              break;
            default:
              LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                         ,400);
              pLVar8 = LogMessage::operator<<(&local_68,"Unimplemented type: ");
              pLVar8 = LogMessage::operator<<
                                 (pLVar8,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                                 (ulong)*(uint *)(lVar16 + 0x2c + lVar12) * 4));
              LogFinisher::operator=(&local_71,pLVar8);
              goto LAB_00208aad;
            }
          }
          lVar17 = lVar17 + 1;
          pDVar9 = this->descriptor_;
          lVar12 = lVar12 + 0x78;
        } while (lVar17 < *(int *)(pDVar9 + 0x2c));
      }
    }
    lVar12 = (long)this->extensions_offset_;
    if (lVar12 != -1) {
      ExtensionSet::Swap((ExtensionSet *)
                         ((long)&(message1->super_MessageLite)._vptr_MessageLite + lVar12),
                         (ExtensionSet *)
                         ((long)&(message2->super_MessageLite)._vptr_MessageLite + lVar12));
    }
    iVar6 = (*(this->super_Reflection)._vptr_Reflection[3])(this,message1);
    iVar7 = (*(this->super_Reflection)._vptr_Reflection[3])(this,message2);
    uVar5 = *(undefined8 *)CONCAT44(extraout_var_03,iVar6);
    *(undefined8 *)CONCAT44(extraout_var_03,iVar6) = *(undefined8 *)CONCAT44(extraout_var_04,iVar7);
    *(undefined8 *)CONCAT44(extraout_var_04,iVar7) = uVar5;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::Swap(
    Message* message1,
    Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
    << "First argument to Swap() (of type \""
    << message1->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
    << "Second argument to Swap() (of type \""
    << message2->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";

  uint32* has_bits1 = MutableHasBits(message1);
  uint32* has_bits2 = MutableHasBits(message2);
  int has_bits_size = (descriptor_->field_count() + 31) / 32;

  for (int i = 0; i < has_bits_size; i++) {
    std::swap(has_bits1[i], has_bits2[i]);
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define SWAP_ARRAYS(CPPTYPE, TYPE)                                           \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          MutableRaw<RepeatedField<TYPE> >(message1, field)->Swap(           \
              MutableRaw<RepeatedField<TYPE> >(message2, field));            \
          break;

          SWAP_ARRAYS(INT32 , int32 );
          SWAP_ARRAYS(INT64 , int64 );
          SWAP_ARRAYS(UINT32, uint32);
          SWAP_ARRAYS(UINT64, uint64);
          SWAP_ARRAYS(FLOAT , float );
          SWAP_ARRAYS(DOUBLE, double);
          SWAP_ARRAYS(BOOL  , bool  );
          SWAP_ARRAYS(ENUM  , int   );
#undef SWAP_ARRAYS

        case FieldDescriptor::CPPTYPE_STRING:
        case FieldDescriptor::CPPTYPE_MESSAGE:
          MutableRaw<RepeatedPtrFieldBase>(message1, field)->Swap(
              MutableRaw<RepeatedPtrFieldBase>(message2, field));
          break;

        default:
          GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
      }
    } else {
      switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)                                           \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          std::swap(*MutableRaw<TYPE>(message1, field),                      \
                    *MutableRaw<TYPE>(message2, field));                     \
          break;

          SWAP_VALUES(INT32 , int32 );
          SWAP_VALUES(INT64 , int64 );
          SWAP_VALUES(UINT32, uint32);
          SWAP_VALUES(UINT64, uint64);
          SWAP_VALUES(FLOAT , float );
          SWAP_VALUES(DOUBLE, double);
          SWAP_VALUES(BOOL  , bool  );
          SWAP_VALUES(ENUM  , int   );
#undef SWAP_VALUES
        case FieldDescriptor::CPPTYPE_MESSAGE:
          std::swap(*MutableRaw<Message*>(message1, field),
                    *MutableRaw<Message*>(message2, field));
          break;

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              std::swap(*MutableRaw<string*>(message1, field),
                        *MutableRaw<string*>(message2, field));
              break;
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
      }
    }
  }

  if (extensions_offset_ != -1) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}